

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_aggregate.cpp
# Opt level: O3

void __thiscall
duckdb::PhysicalHashAggregate::SinkDistinctGrouping
          (PhysicalHashAggregate *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSinkInput *input,idx_t grouping_idx)

{
  _Atomic_word *p_Var1;
  LocalSinkState *pLVar2;
  size_type __n;
  int iVar3;
  reference pvVar4;
  reference pvVar5;
  type pDVar6;
  const_reference pvVar7;
  pointer __k;
  const_reference pvVar8;
  pointer pEVar9;
  BoundAggregateExpression *pBVar10;
  mapped_type *pmVar11;
  pointer pDVar12;
  reference pvVar13;
  type this_00;
  pointer pDVar14;
  reference this_01;
  type pGVar15;
  reference this_02;
  type pLVar16;
  reference this_03;
  type this_04;
  const_iterator cVar17;
  BoundReferenceExpression *pBVar18;
  reference pvVar19;
  reference pvVar20;
  idx_t count;
  reference this_05;
  unique_ptr<duckdb::DistinctAggregateData,_std::default_delete<duckdb::DistinctAggregateData>,_true>
  *this_06;
  size_type sVar21;
  unsafe_vector<idx_t> empty_filter;
  SelectionVector sel_vec;
  OperatorSinkInput sink_input;
  DataChunk filtered_input;
  DataChunk filter_chunk;
  InterruptState interrupt_state;
  DataChunk empty_chunk;
  unsafe_vector<idx_t> local_1c8;
  unique_ptr<duckdb::DistinctAggregateData,_std::default_delete<duckdb::DistinctAggregateData>,_true>
  *local_1a8;
  _Hashtable<duckdb::Expression_*,_std::pair<duckdb::Expression_*const,_unsigned_long>,_std::allocator<std::pair<duckdb::Expression_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::Expression_*>,_std::hash<duckdb::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_1a0;
  pointer *local_198;
  vector<duckdb::unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>,_true>
  *local_190;
  unique_ptr<duckdb::DistinctAggregateState,_std::default_delete<duckdb::DistinctAggregateState>,_true>
  *local_188;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_180;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *local_178;
  pointer local_170;
  GroupedAggregateData *local_168;
  SelectionVector local_160;
  OperatorSinkInput local_148;
  DataChunk local_130;
  DataChunk local_f0;
  InterruptState local_b0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_88 [24];
  DataChunk local_70;
  
  pLVar2 = input->local_state;
  pvVar4 = vector<duckdb::HashAggregateGroupingGlobalState,_true>::operator[]
                     ((vector<duckdb::HashAggregateGroupingGlobalState,_true> *)
                      (input->global_state + 1),grouping_idx);
  pvVar5 = vector<duckdb::HashAggregateGroupingLocalState,_true>::operator[]
                     ((vector<duckdb::HashAggregateGroupingLocalState,_true> *)
                      &pLVar2[2].partition_info.min_batch_index,grouping_idx);
  pDVar6 = unique_ptr<duckdb::DistinctAggregateCollectionInfo,_std::default_delete<duckdb::DistinctAggregateCollectionInfo>,_true>
           ::operator*(&this->distinct_collection_info);
  pvVar7 = vector<duckdb::HashAggregateGroupingData,_true>::operator[]
                     (&this->groupings,grouping_idx);
  DataChunk::DataChunk(&local_70);
  local_1c8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1c8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1c8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  __k = (pDVar6->indices).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start;
  local_170 = (pDVar6->indices).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish;
  if (__k != local_170) {
    local_188 = &pvVar4->distinct_state;
    this_06 = &pvVar7->distinct_data;
    local_168 = &this->grouped_aggregate_data;
    local_178 = &(this->grouped_aggregate_data).aggregates;
    local_180 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&pDVar6->table_map;
    local_190 = &pvVar5->distinct_states;
    local_198 = &pLVar2[2].partition_info.partition_data.
                 super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
                 .
                 super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1a0 = &(this->filter_indexes)._M_h;
    local_1a8 = this_06;
    do {
      pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](local_178,*__k);
      pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar8);
      pBVar10 = BaseExpression::Cast<duckdb::BoundAggregateExpression>
                          (&pEVar9->super_BaseExpression);
      pmVar11 = ::std::__detail::
                _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[](local_180,__k);
      __n = *pmVar11;
      pDVar12 = unique_ptr<duckdb::DistinctAggregateData,_std::default_delete<duckdb::DistinctAggregateData>,_true>
                ::operator->(this_06);
      pvVar13 = vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_true>
                ::operator[](&pDVar12->radix_tables,__n);
      if ((pvVar13->
          super_unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>_>
          )._M_t.
          super___uniq_ptr_impl<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::RadixPartitionedHashTable_*,_std::default_delete<duckdb::RadixPartitionedHashTable>_>
          .super__Head_base<0UL,_duckdb::RadixPartitionedHashTable_*,_false>._M_head_impl !=
          (RadixPartitionedHashTable *)0x0) {
        pDVar12 = unique_ptr<duckdb::DistinctAggregateData,_std::default_delete<duckdb::DistinctAggregateData>,_true>
                  ::operator->(this_06);
        pvVar13 = vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_true>
                  ::operator[](&pDVar12->radix_tables,__n);
        this_00 = unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>
                  ::operator*(pvVar13);
        pDVar14 = unique_ptr<duckdb::DistinctAggregateState,_std::default_delete<duckdb::DistinctAggregateState>,_true>
                  ::operator->(local_188);
        this_01 = vector<duckdb::unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>,_true>
                  ::operator[](&pDVar14->radix_states,__n);
        pGVar15 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
                  ::operator*(this_01);
        this_02 = vector<duckdb::unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>,_true>
                  ::operator[](local_190,__n);
        pLVar16 = unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>
                  ::operator*(this_02);
        InterruptState::InterruptState(&local_b0);
        local_148.global_state = pGVar15;
        local_148.local_state = pLVar16;
        local_148.interrupt_state = &local_b0;
        if ((pBVar10->filter).
            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl == (Expression *)0x0) {
          RadixPartitionedHashTable::Sink(this_00,context,chunk,&local_148,&local_70,&local_1c8);
        }
        else {
          DataChunk::DataChunk(&local_f0);
          this_03 = vector<duckdb::unique_ptr<duckdb::AggregateFilterData,_std::default_delete<duckdb::AggregateFilterData>,_true>,_true>
                    ::operator[]((vector<duckdb::unique_ptr<duckdb::AggregateFilterData,_std::default_delete<duckdb::AggregateFilterData>,_true>,_true>
                                  *)local_198,*__k);
          this_04 = unique_ptr<duckdb::AggregateFilterData,_std::default_delete<duckdb::AggregateFilterData>,_true>
                    ::operator*(this_03);
          DataChunk::GetTypes((vector<duckdb::LogicalType,_true> *)&local_130,
                              &this_04->filtered_payload);
          DataChunk::InitializeEmpty(&local_f0,(vector<duckdb::LogicalType,_true> *)&local_130);
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                    ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_130
                    );
          local_130.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)(pBVar10->filter).
                        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                        ._M_t.
                        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                        .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          cVar17 = ::std::
                   _Hashtable<duckdb::Expression_*,_std::pair<duckdb::Expression_*const,_unsigned_long>,_std::allocator<std::pair<duckdb::Expression_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::Expression_*>,_std::hash<duckdb::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(local_1a0,(key_type *)&local_130);
          pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->(&pBVar10->filter);
          pBVar18 = BaseExpression::Cast<duckdb::BoundReferenceExpression>
                              (&pEVar9->super_BaseExpression);
          pvVar19 = vector<duckdb::Vector,_true>::operator[](&local_f0.data,pBVar18->index);
          pvVar20 = vector<duckdb::Vector,_true>::operator[]
                              (&chunk->data,
                               *(size_type *)
                                ((long)cVar17.
                                       super__Node_iterator_base<std::pair<duckdb::Expression_*const,_unsigned_long>,_false>
                                       ._M_cur + 0x10));
          Vector::Reference(pvVar19,pvVar20);
          local_f0.count = chunk->count;
          SelectionVector::SelectionVector(&local_160,0x800);
          count = ExpressionExecutor::SelectExpression
                            (&this_04->filter_executor,&local_f0,&local_160);
          if (count != 0) {
            DataChunk::DataChunk(&local_130);
            DataChunk::GetTypes((vector<duckdb::LogicalType,_true> *)local_88,chunk);
            DataChunk::InitializeEmpty(&local_130,(vector<duckdb::LogicalType,_true> *)local_88);
            ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                      (local_88);
            if ((this->grouped_aggregate_data).groups.
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                (this->grouped_aggregate_data).groups.
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              sVar21 = 0;
              do {
                pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                         ::operator[](&local_168->groups,sVar21);
                pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         ::operator->(pvVar8);
                pBVar18 = BaseExpression::Cast<duckdb::BoundReferenceExpression>
                                    (&pEVar9->super_BaseExpression);
                pvVar19 = vector<duckdb::Vector,_true>::operator[](&local_130.data,pBVar18->index);
                pvVar20 = vector<duckdb::Vector,_true>::operator[](&chunk->data,pBVar18->index);
                Vector::Reference(pvVar19,pvVar20);
                Vector::Slice(pvVar19,&local_160,count);
                sVar21 = sVar21 + 1;
              } while (sVar21 < (ulong)((long)(this->grouped_aggregate_data).groups.
                                              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                              .
                                              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(this->grouped_aggregate_data).groups.
                                              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                              .
                                              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start >> 3));
            }
            if ((pBVar10->children).
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                (pBVar10->children).
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              sVar21 = 0;
              do {
                this_05 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                          ::operator[](&pBVar10->children,sVar21);
                pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         ::operator->(this_05);
                pBVar18 = BaseExpression::Cast<duckdb::BoundReferenceExpression>
                                    (&pEVar9->super_BaseExpression);
                pvVar19 = vector<duckdb::Vector,_true>::operator[](&local_130.data,pBVar18->index);
                pvVar20 = vector<duckdb::Vector,_true>::operator[](&chunk->data,pBVar18->index);
                Vector::Reference(pvVar19,pvVar20);
                Vector::Slice(pvVar19,&local_160,count);
                sVar21 = sVar21 + 1;
              } while (sVar21 < (ulong)((long)(pBVar10->children).
                                              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                              .
                                              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(pBVar10->children).
                                              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                              .
                                              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start >> 3));
            }
            local_130.count = count;
            RadixPartitionedHashTable::Sink
                      (this_00,context,&local_130,&local_148,&local_70,&local_1c8);
            DataChunk::~DataChunk(&local_130);
            this_06 = local_1a8;
          }
          if (local_160.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_160.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          DataChunk::~DataChunk(&local_f0);
        }
        if (local_b0.signal_state.internal.
            super___weak_ptr<duckdb::InterruptDoneSignalState,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var1 = &(local_b0.signal_state.internal.
                       super___weak_ptr<duckdb::InterruptDoneSignalState,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi)->_M_weak_count;
            iVar3 = *p_Var1;
            *p_Var1 = *p_Var1 + -1;
            UNLOCK();
          }
          else {
            iVar3 = (local_b0.signal_state.internal.
                     super___weak_ptr<duckdb::InterruptDoneSignalState,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_weak_count;
            (local_b0.signal_state.internal.
             super___weak_ptr<duckdb::InterruptDoneSignalState,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_weak_count = iVar3 + -1;
          }
          if (iVar3 == 1) {
            (*(local_b0.signal_state.internal.
               super___weak_ptr<duckdb::InterruptDoneSignalState,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
          }
        }
        if (local_b0.current_task.internal.
            super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var1 = &(local_b0.current_task.internal.
                       super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                      ->_M_weak_count;
            iVar3 = *p_Var1;
            *p_Var1 = *p_Var1 + -1;
            UNLOCK();
          }
          else {
            iVar3 = (local_b0.current_task.internal.
                     super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                    _M_weak_count;
            (local_b0.current_task.internal.
             super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_weak_count = iVar3 + -1;
          }
          if (iVar3 == 1) {
            (*(local_b0.current_task.internal.
               super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _vptr__Sp_counted_base[3])();
          }
        }
      }
      __k = __k + 1;
    } while (__k != local_170);
    if (local_1c8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1c8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  DataChunk::~DataChunk(&local_70);
  return;
}

Assistant:

void PhysicalHashAggregate::SinkDistinctGrouping(ExecutionContext &context, DataChunk &chunk, OperatorSinkInput &input,
                                                 idx_t grouping_idx) const {
	auto &sink = input.local_state.Cast<HashAggregateLocalSinkState>();
	auto &global_sink = input.global_state.Cast<HashAggregateGlobalSinkState>();

	auto &grouping_gstate = global_sink.grouping_states[grouping_idx];
	auto &grouping_lstate = sink.grouping_states[grouping_idx];
	auto &distinct_info = *distinct_collection_info;

	auto &distinct_state = grouping_gstate.distinct_state;
	auto &distinct_data = groupings[grouping_idx].distinct_data;

	DataChunk empty_chunk;

	// Create an empty filter for Sink, since we don't need to update any aggregate states here
	unsafe_vector<idx_t> empty_filter;

	for (idx_t &idx : distinct_info.indices) {
		auto &aggregate = grouped_aggregate_data.aggregates[idx]->Cast<BoundAggregateExpression>();

		D_ASSERT(distinct_info.table_map.count(idx));
		idx_t table_idx = distinct_info.table_map[idx];
		if (!distinct_data->radix_tables[table_idx]) {
			continue;
		}
		D_ASSERT(distinct_data->radix_tables[table_idx]);
		auto &radix_table = *distinct_data->radix_tables[table_idx];
		auto &radix_global_sink = *distinct_state->radix_states[table_idx];
		auto &radix_local_sink = *grouping_lstate.distinct_states[table_idx];

		InterruptState interrupt_state;
		OperatorSinkInput sink_input {radix_global_sink, radix_local_sink, interrupt_state};

		if (aggregate.filter) {
			DataChunk filter_chunk;
			auto &filtered_data = sink.filter_set.GetFilterData(idx);
			filter_chunk.InitializeEmpty(filtered_data.filtered_payload.GetTypes());

			// Add the filter Vector (BOOL)
			auto it = filter_indexes.find(aggregate.filter.get());
			D_ASSERT(it != filter_indexes.end());
			D_ASSERT(it->second < chunk.data.size());
			auto &filter_bound_ref = aggregate.filter->Cast<BoundReferenceExpression>();
			filter_chunk.data[filter_bound_ref.index].Reference(chunk.data[it->second]);
			filter_chunk.SetCardinality(chunk.size());

			// We cant use the AggregateFilterData::ApplyFilter method, because the chunk we need to
			// apply the filter to also has the groups, and the filtered_data.filtered_payload does not have those.
			SelectionVector sel_vec(STANDARD_VECTOR_SIZE);
			idx_t count = filtered_data.filter_executor.SelectExpression(filter_chunk, sel_vec);

			if (count == 0) {
				continue;
			}

			// Because the 'input' chunk needs to be re-used after this, we need to create
			// a duplicate of it, that we can apply the filter to
			DataChunk filtered_input;
			filtered_input.InitializeEmpty(chunk.GetTypes());

			for (idx_t group_idx = 0; group_idx < grouped_aggregate_data.groups.size(); group_idx++) {
				auto &group = grouped_aggregate_data.groups[group_idx];
				auto &bound_ref = group->Cast<BoundReferenceExpression>();
				auto &col = filtered_input.data[bound_ref.index];
				col.Reference(chunk.data[bound_ref.index]);
				col.Slice(sel_vec, count);
			}
			for (idx_t child_idx = 0; child_idx < aggregate.children.size(); child_idx++) {
				auto &child = aggregate.children[child_idx];
				auto &bound_ref = child->Cast<BoundReferenceExpression>();
				auto &col = filtered_input.data[bound_ref.index];
				col.Reference(chunk.data[bound_ref.index]);
				col.Slice(sel_vec, count);
			}
			filtered_input.SetCardinality(count);

			radix_table.Sink(context, filtered_input, sink_input, empty_chunk, empty_filter);
		} else {
			radix_table.Sink(context, chunk, sink_input, empty_chunk, empty_filter);
		}
	}
}